

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineSearch.h
# Opt level: O0

string * __thiscall EngineSearch::operator()[abi_cxx11_(EngineSearch *this,Token *token)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view find;
  string_view source;
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  Response *pRVar4;
  string *in_RDX;
  string *in_RDI;
  string_view sVar5;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  string_view title;
  string redirectUrl;
  Result result;
  string url;
  string tokenName;
  Result *in_stack_fffffffffffff9a8;
  Result *in_stack_fffffffffffff9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff9c0;
  size_t in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  allocator<char> *paVar6;
  Response *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  undefined1 condition;
  char (*in_stack_fffffffffffffa08) [2];
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  char (*in_stack_fffffffffffffa18) [14];
  undefined8 in_stack_fffffffffffffa20;
  undefined1 *start;
  Result *this_00;
  undefined7 in_stack_fffffffffffffa30;
  string *this_01;
  string *this_02;
  undefined8 in_stack_fffffffffffffa58;
  Error EVar7;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  string local_520 [39];
  allocator<char> local_4f9;
  string local_4f8 [8];
  string *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb18;
  SearchBase *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb40;
  allocator<char> local_4a9;
  string local_4a8 [32];
  undefined1 local_488 [16];
  undefined8 local_478;
  undefined8 uStack_470;
  allocator<char> local_459;
  string local_458 [39];
  allocator<char> local_431;
  string local_430 [32];
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  undefined1 local_2a8 [64];
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  Result local_d0;
  string local_90 [64];
  string local_50 [55];
  allocator<char> local_19;
  string *local_18;
  
  uVar1 = (undefined1)((ulong)in_stack_fffffffffffffa20 >> 0x38);
  EVar7 = (Error)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  if (*(int *)(in_RDX + 0x20) == 0) {
    local_18 = in_RDX;
    std::__cxx11::string::string(local_50,in_RDX);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8);
    find._M_str._0_7_ = in_stack_fffffffffffff9f0;
    find._M_len = (size_t)in_stack_fffffffffffff9e8;
    find._M_str._7_1_ = in_stack_fffffffffffff9f7;
    sVar5._M_str = (char *)in_stack_fffffffffffff9e0;
    sVar5._M_len = (size_t)in_stack_fffffffffffff9d8;
    ::str::replace_all(in_stack_fffffffffffff9d0,find,sVar5);
    std::operator+((char *)in_stack_fffffffffffff9f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0));
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
    httplib::Client::Get((Client *)in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    httplib::Result::operator_cast_to_bool((Result *)0x1be967);
    httplib::Result::error(&local_d0);
    httplib::to_string_abi_cxx11_(EVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
    std::operator+(&in_stack_fffffffffffff9e8->version,in_stack_fffffffffffff9e0);
    check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
              ((bool)uVar1,in_stack_fffffffffffffa18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
               in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::__cxx11::string::~string(local_118);
    pRVar4 = httplib::Result::operator->((Result *)0x1beb1e);
    if (pRVar4->status != 200) {
      httplib::Result::operator->((Result *)0x1beb40);
    }
    httplib::Result::operator->((Result *)0x1beb6c);
    check<std::__cxx11::string&>
              (SUB81((ulong)in_stack_fffffffffffffa00 >> 0x38,0),in_stack_fffffffffffff9f8);
    pRVar4 = httplib::Result::operator->((Result *)0x1beb94);
    if (pRVar4->status == 0x12e) {
      httplib::Result::operator->((Result *)0x1bebae);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
      httplib::Response::get_header_value
                (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                 (size_t)in_stack_fffffffffffff9d8);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::find((char *)local_220,0x25061e);
      std::__cxx11::string::substr((ulong)local_268,(ulong)local_220);
      this_02 = local_220;
      this_01 = local_268;
      std::__cxx11::string::operator=(this_02,this_01);
      std::__cxx11::string::~string(this_01);
      std::__cxx11::string::c_str();
      EVar7 = (Error)((ulong)&local_2c9 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
      httplib::Client::Get((Client *)in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
      this_00 = &local_d0;
      start = local_2a8;
      httplib::Result::operator=(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
      httplib::Result::~Result(in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      uVar1 = httplib::Result::operator_cast_to_bool((Result *)0x1bed67);
      httplib::Result::error(this_00);
      httplib::to_string_abi_cxx11_(EVar7);
      paVar6 = &local_3b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
      std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
      std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
      std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
      std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
      std::operator+(&in_stack_fffffffffffff9e8->version,in_stack_fffffffffffff9e0);
      check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                (SUB81((ulong)start >> 0x38,0),(char (*) [14])paVar6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                 in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      condition = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::string::~string(local_330);
      std::__cxx11::string::~string(local_350);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      std::__cxx11::string::~string(local_2f0);
      httplib::Result::operator->((Result *)0x1bef1d);
      httplib::Result::operator->((Result *)0x1bef36);
      check<std::__cxx11::string&>((bool)condition,in_stack_fffffffffffff9f8);
      pRVar4 = httplib::Result::operator->((Result *)0x1bef58);
      local_410 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pRVar4->body);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
      source._M_str = (char *)this_02;
      source._M_len = (size_t)this_01;
      snip_between(source,(string *)CONCAT17(uVar1,in_stack_fffffffffffffa30),(string *)this_00,
                   (size_t)start);
      local_3e8 = local_400;
      uStack_3e0 = uStack_3f8;
      std::__cxx11::string::~string(local_458);
      std::allocator<char>::~allocator(&local_459);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator(&local_431);
      local_478 = local_3e8;
      uStack_470 = uStack_3e0;
      std::operator+(in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0);
      local_488 = std::__cxx11::string::operator_cast_to_basic_string_view(local_4a8);
      __x._M_str = (char *)in_stack_fffffffffffff9e0;
      __x._M_len = (size_t)in_stack_fffffffffffff9d8;
      __y._M_str = (char *)in_stack_fffffffffffff9d0;
      __y._M_len = in_stack_fffffffffffff9c8;
      bVar2 = std::operator!=(__x,__y);
      std::__cxx11::string::~string(local_4a8);
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)in_RDI,local_90);
      }
      else {
        paVar6 = &local_4a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar2,in_stack_fffffffffffff9f0),(char *)paVar6,
                   (allocator<char> *)in_stack_fffffffffffff9e0);
        std::allocator<char>::~allocator(&local_4a9);
      }
      std::__cxx11::string::~string(local_220);
    }
    else {
      httplib::Result::operator->((Result *)0x1bf598);
      sVar5 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_18);
      paVar6 = &local_4f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,paVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 (char *)in_stack_fffffffffffff9e8,paVar6);
      SearchBase::findLinkToSubtoken
                (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,sVar5,in_stack_fffffffffffffb10
                 ,in_stack_fffffffffffffb40);
      std::__cxx11::string::~string(local_520);
      std::allocator<char>::~allocator(&local_521);
      std::__cxx11::string::~string(local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      bVar3 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                        ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         0x1bf69b);
      if (bVar3) {
        std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::value
                  ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   in_stack_fffffffffffff9b0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9e8,
                   paVar6);
        std::allocator<char>::~allocator(&local_523);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                   (char *)in_stack_fffffffffffff9e8,paVar6);
        std::allocator<char>::~allocator(&local_522);
      }
    }
    httplib::Result::~Result(in_stack_fffffffffffff9b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
               (char *)in_stack_fffffffffffff9e8,(allocator<char> *)in_stack_fffffffffffff9e0);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::std) {
				return "";
			}

			std::string tokenName = token.content;
			str::replace_all(tokenName, "::", "%3A%3A");

			const std::string url = "/mwiki/index.php?title=Special%3ASearch&search=" + tokenName;
			httplib::Result result = tokenClient.Get(url.c_str());
			check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
			check((result->status == 200) or (result->status == 302), result->reason);

			if (result->status == 302) { // direct hit!
				std::string redirectUrl = result->get_header_value("Location");
				redirectUrl = redirectUrl.substr(redirectUrl.find("/w"));

				result = tokenClient.Get(redirectUrl.c_str());
				check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
				check(result->status == 200, result->reason);

				const std::string_view title = snip_between(result->body, "<title>", "</title>").first;
				if (title != (token.content + " - cppreference.com")) {
					return "";
				}

				return url;
			}

			const std::optional<std::string_view> link = findLinkToSubtoken(result->body, token.content, ">", "<");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}